

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression_test.cpp
# Opt level: O0

vector<long_long,_std::allocator<long_long>_> *
populateVector(vector<long_long,_std::allocator<long_long>_> *__return_storage_ptr__,int n)

{
  int iVar1;
  long local_28;
  int local_1c;
  undefined1 local_15;
  int i;
  vector<long_long,_std::allocator<long_long>_> *pvStack_10;
  int n_local;
  vector<long_long,_std::allocator<long_long>_> *v;
  
  local_15 = 0;
  i = n;
  pvStack_10 = __return_storage_ptr__;
  std::vector<long_long,_std::allocator<long_long>_>::vector(__return_storage_ptr__);
  for (local_1c = 0; local_1c < i; local_1c = local_1c + 1) {
    iVar1 = rand();
    local_28 = (long)(iVar1 + -0x3fffffff);
    std::vector<long_long,_std::allocator<long_long>_>::push_back(__return_storage_ptr__,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ll> populateVector(int n) {
    vector<ll> v;
    rep(i,0,n) {
        v.push_back(rand() - RAND_MAX/2);
    }
    return v;
}